

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bezier.cpp
# Opt level: O1

Vector3 * __thiscall
Bezier::getPoint(Vector3 *__return_storage_ptr__,Bezier *this,double t,double theta)

{
  double local_110;
  double local_108;
  double local_100;
  double local_f8;
  Vector3 local_f0;
  Vector3 local_d8;
  Vector3 local_c0;
  Vector3 local_a8;
  Vector3 local_90;
  Vector3 local_78;
  Vector3 local_60;
  Vector3 local_48;
  
  local_90.x = Polynomial::operator()(&this->py,t);
  local_90.y = local_90.x;
  local_90.z = local_90.x;
  operator*(&local_90,&this->Dz);
  operator+(&this->P,&local_78);
  local_f8 = Polynomial::operator()(&this->px,t);
  operator*(&this->Dx,&local_f8);
  local_100 = cos(theta);
  operator*(&local_c0,&local_100);
  operator+(&local_60,&local_a8);
  local_108 = Polynomial::operator()(&this->px,t);
  operator*(&this->Dy,&local_108);
  local_110 = sin(theta);
  operator*(&local_f0,&local_110);
  operator+(&local_48,&local_d8);
  return __return_storage_ptr__;
}

Assistant:

Vector3 Bezier::getPoint(double t, double theta)
{
    return P + py(t) * Dz + Dx * px(t) * cos(theta) + Dy * px(t) * sin(theta);
}